

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnitIndex.cpp
# Opt level: O1

Entry * __thiscall llvm::DWARFUnitIndex::getFromHash(DWARFUnitIndex *this,uint64_t S)

{
  uint uVar1;
  Entry *pEVar2;
  ulong uVar3;
  Entry *pEVar4;
  bool bVar5;
  
  uVar1 = (this->Header).NumBuckets - 1;
  uVar3 = (ulong)((uint)S & uVar1);
  pEVar2 = (this->Rows)._M_t.
           super___uniq_ptr_impl<llvm::DWARFUnitIndex::Entry,_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry_*,_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
           .super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry_*,_false>._M_head_impl;
  bVar5 = pEVar2[uVar3].Signature == S;
  if (pEVar2[uVar3].Signature == 0 || bVar5) {
    pEVar4 = pEVar2 + uVar3;
  }
  else {
    do {
      uVar3 = (ulong)((int)uVar3 + ((uint)(S >> 0x20) & uVar1 | 1) & uVar1);
      pEVar4 = pEVar2 + uVar3;
      bVar5 = pEVar4->Signature == S;
      if (bVar5) break;
    } while (pEVar4->Signature != 0);
  }
  pEVar2 = (Entry *)0x0;
  if (bVar5) {
    pEVar2 = pEVar4;
  }
  return pEVar2;
}

Assistant:

const DWARFUnitIndex::Entry *DWARFUnitIndex::getFromHash(uint64_t S) const {
  uint64_t Mask = Header.NumBuckets - 1;

  auto H = S & Mask;
  auto HP = ((S >> 32) & Mask) | 1;
  while (Rows[H].getSignature() != S && Rows[H].getSignature() != 0)
    H = (H + HP) & Mask;

  if (Rows[H].getSignature() != S)
    return nullptr;

  return &Rows[H];
}